

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

void __thiscall
QFragmentMapData<QTextBlockData>::rebalance(QFragmentMapData<QTextBlockData> *this,uint x)

{
  uint uVar1;
  uint uVar2;
  QTextBlockData *pQVar3;
  uint in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  bool bVar4;
  QFragmentMapData<QTextBlockData> *unaff_retaddr;
  uint y_1;
  uint y;
  uint pp;
  uint p;
  uint local_14;
  uint local_10;
  uint local_c;
  QFragmentMapData<QTextBlockData> *pQVar5;
  
  pQVar5 = in_RDI;
  pQVar3 = F(in_RDI,in_ESI);
  (pQVar3->super_QFragment<3>).color = 0;
  local_c = in_ESI;
  while( true ) {
    pQVar3 = F(in_RDI,local_c);
    bVar4 = false;
    if ((pQVar3->super_QFragment<3>).parent != 0) {
      pQVar3 = F(in_RDI,local_c);
      pQVar3 = F(in_RDI,(pQVar3->super_QFragment<3>).parent);
      bVar4 = (pQVar3->super_QFragment<3>).color == 0;
    }
    if (!bVar4) break;
    pQVar3 = F(in_RDI,local_c);
    uVar2 = (pQVar3->super_QFragment<3>).parent;
    pQVar3 = F(in_RDI,uVar2);
    local_14 = (pQVar3->super_QFragment<3>).parent;
    pQVar3 = F(in_RDI,local_14);
    local_10 = uVar2;
    if (uVar2 == (pQVar3->super_QFragment<3>).left) {
      pQVar3 = F(in_RDI,local_14);
      uVar1 = (pQVar3->super_QFragment<3>).right;
      if ((uVar1 == 0) || (pQVar3 = F(in_RDI,uVar1), (pQVar3->super_QFragment<3>).color != 0)) {
        pQVar3 = F(in_RDI,uVar2);
        if (local_c == (pQVar3->super_QFragment<3>).right) {
          rotateLeft(unaff_retaddr,(uint)((ulong)pQVar5 >> 0x20));
          pQVar3 = F(in_RDI,uVar2);
          local_10 = (pQVar3->super_QFragment<3>).parent;
          pQVar3 = F(in_RDI,local_10);
          local_14 = (pQVar3->super_QFragment<3>).parent;
          local_c = uVar2;
        }
        pQVar3 = F(in_RDI,local_10);
        (pQVar3->super_QFragment<3>).color = 1;
        if (local_14 != 0) {
          pQVar3 = F(in_RDI,local_14);
          (pQVar3->super_QFragment<3>).color = 0;
          rotateRight(unaff_retaddr,(uint)((ulong)pQVar5 >> 0x20));
        }
      }
      else {
        pQVar3 = F(in_RDI,uVar2);
        (pQVar3->super_QFragment<3>).color = 1;
        pQVar3 = F(in_RDI,uVar1);
        (pQVar3->super_QFragment<3>).color = 1;
        pQVar3 = F(in_RDI,local_14);
        (pQVar3->super_QFragment<3>).color = 0;
        local_c = local_14;
      }
    }
    else {
      pQVar3 = F(in_RDI,local_14);
      uVar1 = (pQVar3->super_QFragment<3>).left;
      if ((uVar1 == 0) || (pQVar3 = F(in_RDI,uVar1), (pQVar3->super_QFragment<3>).color != 0)) {
        pQVar3 = F(in_RDI,uVar2);
        if (local_c == (pQVar3->super_QFragment<3>).left) {
          rotateRight(unaff_retaddr,(uint)((ulong)pQVar5 >> 0x20));
          pQVar3 = F(in_RDI,uVar2);
          local_10 = (pQVar3->super_QFragment<3>).parent;
          pQVar3 = F(in_RDI,local_10);
          local_14 = (pQVar3->super_QFragment<3>).parent;
          local_c = uVar2;
        }
        pQVar3 = F(in_RDI,local_10);
        (pQVar3->super_QFragment<3>).color = 1;
        if (local_14 != 0) {
          pQVar3 = F(in_RDI,local_14);
          (pQVar3->super_QFragment<3>).color = 0;
          rotateLeft(unaff_retaddr,(uint)((ulong)pQVar5 >> 0x20));
        }
      }
      else {
        pQVar3 = F(in_RDI,uVar2);
        (pQVar3->super_QFragment<3>).color = 1;
        pQVar3 = F(in_RDI,uVar1);
        (pQVar3->super_QFragment<3>).color = 1;
        pQVar3 = F(in_RDI,local_14);
        (pQVar3->super_QFragment<3>).color = 0;
        local_c = local_14;
      }
    }
  }
  uVar2 = root(in_RDI);
  pQVar3 = F(in_RDI,uVar2);
  (pQVar3->super_QFragment<3>).color = 1;
  return;
}

Assistant:

void QFragmentMapData<Fragment>::rebalance(uint x)
{
    F(x).color = Red;

    while (F(x).parent && F(F(x).parent).color == Red) {
        uint p = F(x).parent;
        uint pp = F(p).parent;
        Q_ASSERT(pp);
        if (p == F(pp).left) {
            uint y = F(pp).right;
            if (y && F(y).color == Red) {
                F(p).color = Black;
                F(y).color = Black;
                F(pp).color = Red;
                x = pp;
            } else {
                if (x == F(p).right) {
                    x = p;
                    rotateLeft(x);
                    p = F(x).parent;
                    pp = F(p).parent;
                }
                F(p).color = Black;
                if (pp) {
                    F(pp).color = Red;
                    rotateRight(pp);
                }
            }
        } else {
            uint y = F(pp).left;
            if (y && F(y).color == Red) {
                F(p).color = Black;
                F(y).color = Black;
                F(pp).color = Red;
                x = pp;
            } else {
                if (x == F(p).left) {
                    x = p;
                    rotateRight(x);
                    p = F(x).parent;
                    pp = F(p).parent;
                }
                F(p).color = Black;
                if (pp) {
                    F(pp).color = Red;
                    rotateLeft(pp);
                }
            }
        }
    }
    F(root()).color = Black;
}